

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O0

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiLight>::~TempArray(TempArray<std::vector,_aiLight> *this)

{
  bool bVar1;
  reference ppaVar2;
  aiLight *elem;
  iterator __end0;
  iterator __begin0;
  mywrap *__range3;
  TempArray<std::vector,_aiLight> *this_local;
  
  __end0 = ::std::vector<aiLight_*,_std::allocator<aiLight_*>_>::begin(&this->arr);
  elem = (aiLight *)::std::vector<aiLight_*,_std::allocator<aiLight_*>_>::end(&this->arr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>
                                *)&elem);
    if (!bVar1) break;
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>::
              operator*(&__end0);
    if (*ppaVar2 != (aiLight *)0x0) {
      operator_delete(*ppaVar2,0x46c);
    }
    __gnu_cxx::__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>::
    operator++(&__end0);
  }
  ::std::vector<aiLight_*,_std::allocator<aiLight_*>_>::~vector(&this->arr);
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }